

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::image::anon_unknown_0::BaseTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseTestInstance *this)

{
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkQueue queue_00;
  ProgramCollection<vk::ProgramBinary> *this_00;
  char *__s;
  ProgramBinary *binary;
  undefined4 extraout_var;
  Handle<(vk::HandleType)16> *pHVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  Handle<(vk::HandleType)24> *pHVar7;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  int local_32c;
  uint local_294;
  int layerNdx;
  int loopNumLayers;
  IVec3 workSize;
  Move<vk::VkCommandBuffer_s_*> local_270;
  RefData<vk::VkCommandBuffer_s_*> local_250;
  undefined1 local_230 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1f0;
  undefined1 local_1d0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_180;
  undefined1 local_160 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_138;
  RefData<vk::Handle<(vk::HandleType)16>_> local_118;
  undefined1 local_f8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  VkDescriptorSetLayout descriptorSetLayout;
  allocator<char> local_b9;
  string local_b8;
  Move<vk::Handle<(vk::HandleType)14>_> local_98;
  RefData<vk::Handle<(vk::HandleType)14>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  BaseTestInstance *this_local;
  
  (*(this->super_TestInstance)._vptr_TestInstance[9])();
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  __s = "comp_fmt_unknown";
  if ((this->m_declareImageFormatInShader & 1U) != 0) {
    __s = "comp";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,__s,&local_b9);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_b8);
  ::vk::createShaderModule(&local_98,deviceInterface,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._0_4_ =
       (*(this->super_TestInstance)._vptr_TestInstance[3])();
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._4_4_ =
       extraout_var;
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  makePipelineLayout(&local_138,deviceInterface,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&local_138);
  data_00.deleter.m_deviceIface = local_118.deleter.m_deviceIface;
  data_00.object.m_internal = local_118.object.m_internal;
  data_00.deleter.m_device = local_118.deleter.m_device;
  data_00.deleter.m_allocator = local_118.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_f8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_138);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_f8);
  pipelineLayout_00.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_58);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar6->m_internal;
  makeComputePipeline(&local_1a0,deviceInterface,device_00,pipelineLayout_00,
                      (VkShaderModule)
                      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_180,(Move *)&local_1a0);
  data_01.deleter.m_deviceIface = local_180.deleter.m_deviceIface;
  data_01.object.m_internal = local_180.object.m_internal;
  data_01.deleter.m_device = local_180.deleter.m_device;
  data_01.deleter.m_allocator = local_180.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_160,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_1a0);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,deviceInterface
             ,device_00,1,
             shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator.
             _4_4_,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1f0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface = local_1f0.deleter.m_deviceIface;
  data_02.object.m_internal = local_1f0.object.m_internal;
  data_02.deleter.m_device = local_1f0.deleter.m_device;
  data_02.deleter.m_allocator = local_1f0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1d0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_1d0);
  ::vk::allocateCommandBuffer
            (&local_270,deviceInterface,device_00,(VkCommandPool)pHVar7->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_250,(Move *)&local_270);
  data_03.deleter.m_deviceIface = local_250.deleter.m_deviceIface;
  data_03.object = local_250.object;
  data_03.deleter.m_device = local_250.deleter.m_device;
  data_03.deleter.m_pool.m_internal = local_250.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_230,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_270);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
  beginCommandBuffer(deviceInterface,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
  pVVar1 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_160);
  workSize.m_data._4_8_ = pHVar9->m_internal;
  (*deviceInterface->_vptr_DeviceInterface[0x4c])(deviceInterface,pVVar1,1,workSize.m_data._4_8_);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,*ppVVar8);
  if ((this->m_singleLayerBind & 1U) == 0) {
    Texture::size((Texture *)&layerNdx);
  }
  else {
    Texture::layerSize((Texture *)&layerNdx);
  }
  if ((this->m_singleLayerBind & 1U) == 0) {
    local_32c = 1;
  }
  else {
    local_32c = Texture::numLayers(&this->m_texture);
  }
  for (local_294 = 0; (int)local_294 < local_32c; local_294 = local_294 + 1) {
    ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
    pVVar1 = *ppVVar8;
    pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_f8);
    (*(this->super_TestInstance)._vptr_TestInstance[8])
              (this,pVVar1,pHVar5->m_internal,(ulong)local_294);
    if (0 < (int)local_294) {
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
      (*(this->super_TestInstance)._vptr_TestInstance[6])(this,*ppVVar8);
    }
    ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
    pVVar1 = *ppVVar8;
    uVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&layerNdx);
    uVar3 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&layerNdx);
    uVar4 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&layerNdx);
    (*deviceInterface->_vptr_DeviceInterface[0x5d])
              (deviceInterface,pVVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  }
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
  endCommandBuffer(deviceInterface,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_230);
  submitCommandsAndWait(deviceInterface,device_00,queue_00,*ppVVar8);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(__return_storage_ptr__);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_230);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1d0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_160);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseTestInstance::iterate (void)
{
	checkRequirements();

	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					device				= m_context.getDevice();
	const VkQueue					queue				= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get(m_declareImageFormatInShader ? "comp" : "comp_fmt_unknown"), 0));

	const VkDescriptorSetLayout descriptorSetLayout = prepareDescriptors();
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(createCommandPool(vk, device, VK_COMMAND_POOL_RESET_RELEASE_RESOURCES_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	commandBeforeCompute(*cmdBuffer);

	const tcu::IVec3 workSize = (m_singleLayerBind ? m_texture.layerSize() : m_texture.size());
	const int loopNumLayers = (m_singleLayerBind ? m_texture.numLayers() : 1);
	for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
	{
		commandBindDescriptorsForLayer(*cmdBuffer, *pipelineLayout, layerNdx);

		if (layerNdx > 0)
			commandBetweenShaderInvocations(*cmdBuffer);

		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
	}

	commandAfterCompute(*cmdBuffer);

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	return verifyResult();
}